

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void swap_screen(Terminal *term,wchar_t which,_Bool reset,_Bool keep_cur_pos)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined4 uVar3;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  wchar_t wVar13;
  undefined4 uVar14;
  tree234 *ptVar15;
  tree234 *screen;
  truecolour tVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  _Bool _Var19;
  uint uVar20;
  _Bool _Var21;
  wchar_t wVar22;
  bool bVar23;
  pos pVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  bVar23 = which == L'\0';
  if (term->alt_which != which) {
    ptVar15 = term->alt_screen;
    if (((term->erase_to_scrollback == true) &&
        (term->alt_which != L'\0' && ptVar15 != (tree234 *)0x0)) && (term->disptop < L'\0')) {
      uVar20 = term->disptop + term->alt_sblines;
      term->disptop = (int)uVar20 >> 0x1f & uVar20;
    }
    term->alt_which = which;
    screen = term->screen;
    term->alt_screen = screen;
    term->screen = ptVar15;
    if (screen == (tree234 *)0x0) {
      wVar18 = L'\0';
    }
    else {
      wVar18 = find_last_nonempty_line(term,screen);
      wVar18 = wVar18 + L'\x01';
    }
    term->alt_sblines = wVar18;
    wVar13 = (term->curs).x;
    if (!keep_cur_pos && (bVar23 || !reset)) {
      wVar22 = (term->curs).y;
      uVar3 = term->alt_x;
      uVar10 = term->alt_y;
      pVar24.x = uVar3;
      pVar24.y = uVar10;
      term->curs = pVar24;
    }
    else {
      wVar22 = (term->curs).y;
    }
    term->alt_x = wVar13;
    term->alt_y = wVar22;
    if (bVar23 || !reset) {
      wVar17 = term->alt_t;
      term->alt_t = term->marg_t;
      wVar13 = term->marg_b;
      wVar22 = term->cset;
      term->marg_t = wVar17;
      term->marg_b = term->alt_b;
      term->alt_b = wVar13;
      uVar20._0_1_ = term->alt_wnext;
      uVar20._1_1_ = term->alt_ins;
      uVar20._2_1_ = term->alt_om;
      uVar20._3_1_ = term->alt_wrap;
      auVar25 = pshuflw(ZEXT416(uVar20),ZEXT416(uVar20),0xe1);
      uVar2 = term->dec_om;
      uVar5 = term->wrap;
      uVar7 = term->wrapnext;
      uVar9 = term->insert;
      uVar12 = term->cset;
      auVar26._4_4_ = uVar12;
      auVar26[3] = uVar9;
      auVar26[2] = uVar7;
      auVar26[1] = uVar5;
      auVar26[0] = uVar2;
      auVar26._8_8_ = 0;
      uVar14 = auVar25._0_4_;
      term->dec_om = (_Bool)(char)uVar14;
      term->wrap = (_Bool)(char)((uint)uVar14 >> 8);
      term->wrapnext = (_Bool)(char)((uint)uVar14 >> 0x10);
      term->insert = (_Bool)(char)((uint)uVar14 >> 0x18);
      auVar25 = pshuflw(auVar25,auVar26,0xe1);
      uVar14 = auVar25._0_4_;
      term->alt_wnext = (_Bool)(char)uVar14;
      term->alt_ins = (_Bool)(char)((uint)uVar14 >> 8);
      term->alt_om = (_Bool)(char)((uint)uVar14 >> 0x10);
      term->alt_wrap = (_Bool)(char)((uint)uVar14 >> 0x18);
      term->cset = term->alt_cset;
      term->alt_cset = wVar22;
      _Var19 = term->utf;
      term->utf = term->alt_utf;
      term->alt_utf = _Var19;
      wVar13 = term->sco_acs;
      term->sco_acs = term->alt_sco_acs;
      term->alt_sco_acs = wVar13;
      pVar24 = term->savecurs;
      term->savecurs = term->alt_savecurs;
      term->alt_savecurs = pVar24;
      wVar13 = term->save_cset;
      wVar22 = term->save_csattr;
      term->save_cset = term->alt_save_cset;
      term->save_csattr = term->alt_save_csattr;
      term->alt_save_cset = wVar13;
      term->alt_save_csattr = wVar22;
      wVar13 = term->save_attr;
      term->save_attr = term->alt_save_attr;
      term->alt_save_attr = wVar13;
      tVar16 = term->save_truecolour;
      term->save_truecolour = term->alt_save_truecolour;
      term->alt_save_truecolour = tVar16;
      _Var19 = term->save_utf;
      term->save_utf = term->alt_save_utf;
      _Var21 = term->save_wnext;
      term->save_wnext = term->alt_save_wnext;
      wVar13 = term->save_sco_acs;
      term->save_sco_acs = term->alt_save_sco_acs;
    }
    else {
      term->alt_t = term->marg_t;
      term->alt_b = term->marg_b;
      uVar1 = term->dec_om;
      uVar4 = term->wrap;
      uVar6 = term->wrapnext;
      uVar8 = term->insert;
      uVar11 = term->cset;
      auVar25._4_4_ = uVar11;
      auVar25[3] = uVar8;
      auVar25[2] = uVar6;
      auVar25[1] = uVar4;
      auVar25[0] = uVar1;
      auVar25._8_8_ = 0;
      auVar25 = pshuflw(auVar25,auVar25,0xe1);
      uVar14 = auVar25._0_4_;
      term->alt_wnext = (_Bool)(char)uVar14;
      term->alt_ins = (_Bool)(char)((uint)uVar14 >> 8);
      term->alt_om = (_Bool)(char)((uint)uVar14 >> 0x10);
      term->alt_wrap = (_Bool)(char)((uint)uVar14 >> 0x18);
      term->alt_cset = term->cset;
      term->alt_utf = term->utf;
      term->alt_sco_acs = term->sco_acs;
      term->alt_savecurs = term->savecurs;
      term->alt_save_cset = term->save_cset;
      term->alt_save_csattr = term->save_csattr;
      term->alt_save_attr = term->save_attr;
      term->alt_save_truecolour = term->save_truecolour;
      _Var19 = term->save_utf;
      _Var21 = term->save_wnext;
      wVar13 = term->save_sco_acs;
    }
    term->alt_save_utf = _Var19;
    term->alt_save_wnext = _Var21;
    term->alt_save_sco_acs = wVar13;
    if (((term->erase_to_scrollback == true) && (term->alt_screen != (tree234 *)0x0)) &&
       ((term->alt_which != L'\0' && (term->disptop < L'\0')))) {
      term->disptop = term->disptop - wVar18;
      wVar18 = sblines(term);
      if (SBORROW4(term->disptop,-wVar18) != term->disptop + wVar18 < 0) {
        term->disptop = -wVar18;
      }
    }
  }
  if ((!bVar23 && reset) && (term->screen != (tree234 *)0x0)) {
    erase_lots(term,false,true,true);
    return;
  }
  return;
}

Assistant:

static void swap_screen(Terminal *term, int which,
                        bool reset, bool keep_cur_pos)
{
    int t;
    bool bt;
    pos tp;
    truecolour ttc;
    tree234 *ttr;

    if (!which)
        reset = false;                 /* do no weird resetting if which==0 */

    if (which != term->alt_which) {
        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * We're swapping away from the alternate screen, so some
             * lines are about to vanish from the virtual scrollback.
             * Adjust disptop by that much, so that (if we're not
             * resetting the scrollback anyway on a display event) the
             * current scroll position still ends up pointing at the
             * same text.
             */
            term->disptop += term->alt_sblines;
            if (term->disptop > 0)
                term->disptop = 0;
        }

        term->alt_which = which;

        ttr = term->alt_screen;
        term->alt_screen = term->screen;
        term->screen = ttr;
        term->alt_sblines = (
            term->alt_screen ?
            find_last_nonempty_line(term, term->alt_screen) + 1 : 0);
        t = term->curs.x;
        if (!reset && !keep_cur_pos)
            term->curs.x = term->alt_x;
        term->alt_x = t;
        t = term->curs.y;
        if (!reset && !keep_cur_pos)
            term->curs.y = term->alt_y;
        term->alt_y = t;
        t = term->marg_t;
        if (!reset) term->marg_t = term->alt_t;
        term->alt_t = t;
        t = term->marg_b;
        if (!reset) term->marg_b = term->alt_b;
        term->alt_b = t;
        bt = term->dec_om;
        if (!reset) term->dec_om = term->alt_om;
        term->alt_om = bt;
        bt = term->wrap;
        if (!reset) term->wrap = term->alt_wrap;
        term->alt_wrap = bt;
        bt = term->wrapnext;
        if (!reset) term->wrapnext = term->alt_wnext;
        term->alt_wnext = bt;
        bt = term->insert;
        if (!reset) term->insert = term->alt_ins;
        term->alt_ins = bt;
        t = term->cset;
        if (!reset) term->cset = term->alt_cset;
        term->alt_cset = t;
        bt = term->utf;
        if (!reset) term->utf = term->alt_utf;
        term->alt_utf = bt;
        t = term->sco_acs;
        if (!reset) term->sco_acs = term->alt_sco_acs;
        term->alt_sco_acs = t;

        tp = term->savecurs;
        if (!reset)
            term->savecurs = term->alt_savecurs;
        term->alt_savecurs = tp;
        t = term->save_cset;
        if (!reset)
            term->save_cset = term->alt_save_cset;
        term->alt_save_cset = t;
        t = term->save_csattr;
        if (!reset)
            term->save_csattr = term->alt_save_csattr;
        term->alt_save_csattr = t;
        t = term->save_attr;
        if (!reset)
            term->save_attr = term->alt_save_attr;
        term->alt_save_attr = t;
        ttc = term->save_truecolour;
        if (!reset)
            term->save_truecolour = term->alt_save_truecolour;
        term->alt_save_truecolour = ttc;
        bt = term->save_utf;
        if (!reset)
            term->save_utf = term->alt_save_utf;
        term->alt_save_utf = bt;
        bt = term->save_wnext;
        if (!reset)
            term->save_wnext = term->alt_save_wnext;
        term->alt_save_wnext = bt;
        t = term->save_sco_acs;
        if (!reset)
            term->save_sco_acs = term->alt_save_sco_acs;
        term->alt_save_sco_acs = t;

        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * Inverse of the adjustment at the top of this function.
             * This time, we're swapping _to_ the alternate screen, so
             * some lines are about to _appear_ in the virtual
             * scrollback, and we adjust disptop in the other
             * direction.
             *
             * Both these adjustments depend on the value stored in
             * term->alt_sblines while the alt screen is selected,
             * which is why we had to do one _before_ switching away
             * from it and the other _after_ switching to it.
             */
            term->disptop -= term->alt_sblines;
            int limit = -sblines(term);
            if (term->disptop < limit)
                term->disptop = limit;
        }
    }

    if (reset && term->screen) {
        /*
         * Yes, this _is_ supposed to honour background-colour-erase.
         */
        erase_lots(term, false, true, true);
    }
}